

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

Map * Map_Copy(Map *cpy)

{
  Map *pMVar1;
  Map *ret;
  short i;
  Map *cpy_local;
  
  if (cpy == (Map *)0x0) {
    cpy_local = (Map *)0x0;
  }
  else {
    cpy_local = (Map *)malloc(0x810);
    cpy_local->is_final = cpy->is_final;
    cpy_local->ID = cpy->ID;
    for (ret._6_2_ = 0; ret._6_2_ < 0x100; ret._6_2_ = ret._6_2_ + 1) {
      pMVar1 = Map_Copy(cpy->delta[ret._6_2_]);
      cpy_local->delta[ret._6_2_] = pMVar1;
    }
  }
  return cpy_local;
}

Assistant:

Map* Map_Copy(Map *cpy)
{
	short i;
	Map *ret;

	if(cpy==NULL)
	{
		return NULL;
	}

	ret=malloc(sizeof(Map));
	ret->is_final=cpy->is_final;
	ret->ID=cpy->ID;

	for(i=0;i<256;++i)
	{
		ret->delta[i]=Map_Copy(cpy->delta[i]);
	}
	return ret;
}